

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPaddedHeight(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  int iVar1;
  uint32_t Height;
  undefined4 extraout_var;
  GMM_TEXTURE_CALC *this_00;
  uint32_t local_4c;
  uint32_t local_2c;
  uint32_t VAlign;
  uint32_t MipHeight;
  uint32_t AlignedHeight;
  GMM_TEXTURE_CALC *pTextureCalc;
  uint32_t MipLevel_local;
  GmmResourceInfoCommon *this_local;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  this_00 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar1));
  Height = (*this_00->_vptr_GmmTextureCalc[0x19])(this_00,&this->Surf,(ulong)MipLevel);
  local_2c = (this->Surf).Alignment.VAlign;
  if ((((ulong)(this->AuxSurf).Flags.Gpu >> 1 & 1) != 0) &&
     (((ulong)(this->AuxSurf).Flags.Gpu >> 0x29 & 1) != 0)) {
    local_2c = (this->AuxSurf).Alignment.VAlign;
  }
  if ((((ulong)(this->Surf).Flags.Gpu >> 6 & 1) == 0) &&
     (((ulong)(this->Surf).Flags.Gpu >> 0x1d & 1) == 0)) {
    local_4c = 1;
  }
  else {
    local_4c = (this->Surf).MSAA.NumSamples;
  }
  VAlign = GmmTextureCalc::ExpandHeight(this_00,Height,local_2c,local_4c);
  if (((ulong)(this->Surf).Flags.Gpu >> 0x1d & 1) != 0) {
    if (((ulong)(this->Surf).Flags.Info >> 0x22 & 1) != 0) {
      VAlign = VAlign >> 1;
    }
    switch((this->Surf).MSAA.NumSamples) {
    case 1:
      break;
    case 2:
      break;
    default:
      break;
    case 4:
    case 8:
      VAlign = VAlign >> 1;
      break;
    case 0x10:
      VAlign = VAlign >> 2;
    }
  }
  if ((((ulong)(this->AuxSurf).Flags.Gpu >> 1 & 1) != 0) &&
     (((ulong)(this->AuxSurf).Flags.Gpu >> 0x29 & 1) != 0)) {
    VAlign = (*this_00->_vptr_GmmTextureCalc[0x17])(this_00,&this->AuxSurf,(ulong)VAlign);
  }
  return VAlign;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPaddedHeight(uint32_t MipLevel)
{
    GMM_TEXTURE_CALC *pTextureCalc;
    uint32_t          AlignedHeight, MipHeight;
    uint32_t          VAlign;

    __GMM_ASSERT(MipLevel <= Surf.MaxLod);

    // See note in GmmResGetPaddedWidth.
    __GMM_ASSERT(Surf.Flags.Gpu.Depth || Surf.Flags.Gpu.SeparateStencil ||
                 Surf.Flags.Gpu.CCS || Surf.Flags.Gpu.HiZ ||
                 AuxSurf.Flags.Gpu.__MsaaTileMcs ||
                 AuxSurf.Flags.Gpu.CCS || AuxSurf.Flags.Gpu.__NonMsaaTileYCcs);

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    MipHeight = pTextureCalc->GmmTexGetMipHeight(&Surf, MipLevel);

    VAlign = Surf.Alignment.VAlign;
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        VAlign = AuxSurf.Alignment.VAlign;
    }

    AlignedHeight = __GMM_EXPAND_HEIGHT(pTextureCalc,
                                        MipHeight,
                                        VAlign,
                                        &Surf);

    if(Surf.Flags.Gpu.SeparateStencil)
    {
        if(Surf.Flags.Info.TiledW)
        {
            AlignedHeight /= 2;
        }

        // Reverse MSAA Expansion ////////////////////////////////////////////////
        // See note in GmmResGetPaddedWidth.
        switch(Surf.MSAA.NumSamples)
        {
            case 1:
                break;
            case 2:
                break; // No height adjustment for 2x...
            case 4:    // Same as 8x...
            case 8:
                AlignedHeight /= 2;
                break;
            case 16:
                AlignedHeight /= 4;
                break;
            default:
                __GMM_ASSERT(0);
        }
    }

    // CCS Aux surface, AlignedHeight needs to be scaled by 16
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        AlignedHeight = pTextureCalc->ScaleTextureHeight(&AuxSurf, AlignedHeight);
    }

    return AlignedHeight;
}